

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shift.hpp
# Opt level: O0

unsigned_long mxx::right_shift<unsigned_long>(unsigned_long *t,comm *comm)

{
  MPI_Request poVar1;
  undefined4 uVar2;
  int iVar3;
  int iVar4;
  MPI_Datatype poVar5;
  MPI_Comm poVar6;
  undefined1 local_48 [8];
  MPI_Request recv_req;
  unsigned_long left_value;
  undefined1 local_30 [4];
  int tag;
  datatype dt;
  comm *comm_local;
  unsigned_long *t_local;
  
  dt._16_8_ = comm;
  get_datatype<unsigned_long>();
  left_value._4_4_ = 0xd;
  recv_req = (MPI_Request)0x0;
  iVar3 = mxx::comm::rank((comm *)dt._16_8_);
  if (0 < iVar3) {
    poVar5 = datatype::type((datatype *)local_30);
    iVar3 = mxx::comm::rank((comm *)dt._16_8_);
    uVar2 = left_value._4_4_;
    poVar6 = mxx::comm::operator_cast_to_ompi_communicator_t_((comm *)dt._16_8_);
    MPI_Irecv(&recv_req,1,poVar5,iVar3 + -1,uVar2,poVar6,local_48);
  }
  iVar3 = mxx::comm::rank((comm *)dt._16_8_);
  iVar4 = mxx::comm::size((comm *)dt._16_8_);
  if (iVar3 < iVar4 + -1) {
    poVar5 = datatype::type((datatype *)local_30);
    iVar3 = mxx::comm::rank((comm *)dt._16_8_);
    uVar2 = left_value._4_4_;
    poVar6 = mxx::comm::operator_cast_to_ompi_communicator_t_((comm *)dt._16_8_);
    MPI_Send(t,1,poVar5,iVar3 + 1,uVar2,poVar6);
  }
  iVar3 = mxx::comm::rank((comm *)dt._16_8_);
  if (0 < iVar3) {
    MPI_Wait(local_48,0);
  }
  poVar1 = recv_req;
  datatype::~datatype((datatype *)local_30);
  return (unsigned_long)poVar1;
}

Assistant:

T right_shift(const T& t, const mxx::comm& comm = mxx::comm()) {
    // get datatype
    datatype dt = get_datatype<T>();

    // TODO: handle tags with MXX (get unique tag function)
    int tag = 13;

    T left_value = T();
    MPI_Request recv_req;
    // if not last processor
    if (comm.rank() > 0) {
        MPI_Irecv(&left_value, 1, dt.type(), comm.rank()-1, tag,
                  comm, &recv_req);
    }
    // if not first processor
    if (comm.rank() < comm.size()-1) {
        // send my most right element to the right
        MPI_Send(const_cast<T*>(&t), 1, dt.type(), comm.rank()+1, tag, comm);
    }
    if (comm.rank() > 0) {
        // wait for the async receive to finish
        MPI_Wait(&recv_req, MPI_STATUS_IGNORE);
    }
    return left_value;
}